

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O1

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  pointer ppcVar1;
  char cVar2;
  int iVar3;
  pointer ppcVar4;
  bool bVar5;
  
  ppcVar4 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar5 = ppcVar4 != ppcVar1;
  if (bVar5) {
    iVar3 = (*((*ppcVar4)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])();
    cVar2 = (char)iVar3;
    while (cVar2 == '\0') {
      ppcVar4 = ppcVar4 + 1;
      bVar5 = ppcVar4 != ppcVar1;
      if (ppcVar4 == ppcVar1) {
        return bVar5;
      }
      iVar3 = (*((*ppcVar4)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])();
      cVar2 = (char)iVar3;
    }
  }
  return bVar5;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (auto generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}